

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O3

int __thiscall JetHead::IReaderWriter::readAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  uint uVar2;
  
  if (length < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      iVar1 = (*this->_vptr_IReaderWriter[2])
                        (this,(ulong)uVar2 + (long)buffer,(ulong)(length - uVar2));
      if (iVar1 < 0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        return uVar2;
      }
      uVar2 = uVar2 + iVar1;
    } while ((int)uVar2 < length);
  }
  return uVar2;
}

Assistant:

virtual int readAll(void *buffer, int length)
		{
			int bytesRead = 0;
			
			while (bytesRead < length)
			{
				int result = read((uint8_t*)buffer + bytesRead,
								  length - bytesRead);
				
				if (result < 0)
					return result;
				
				if (result == 0)
					return bytesRead;
				
				bytesRead += result;
			}
			return bytesRead;
		}